

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O0

void Abc_NodeConeCollect(Abc_Obj_t **ppRoots,int nRoots,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVisited,
                        int fIncludeFanins)

{
  int iVar1;
  void *Entry;
  int local_3c;
  int i;
  Abc_Obj_t *pTemp;
  int fIncludeFanins_local;
  Vec_Ptr_t *vVisited_local;
  Vec_Ptr_t *vLeaves_local;
  int nRoots_local;
  Abc_Obj_t **ppRoots_local;
  
  Abc_NodesMark(vLeaves);
  Vec_PtrClear(vVisited);
  if (fIncludeFanins != 0) {
    for (local_3c = 0; iVar1 = Vec_PtrSize(vLeaves), local_3c < iVar1; local_3c = local_3c + 1) {
      Entry = Vec_PtrEntry(vLeaves,local_3c);
      Vec_PtrPush(vVisited,Entry);
    }
  }
  for (local_3c = 0; local_3c < nRoots; local_3c = local_3c + 1) {
    Abc_NodeConeMarkCollect_rec(ppRoots[local_3c],vVisited);
  }
  Abc_NodesUnmark(vLeaves);
  Abc_NodesUnmark(vVisited);
  return;
}

Assistant:

void Abc_NodeConeCollect( Abc_Obj_t ** ppRoots, int nRoots, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVisited, int fIncludeFanins )
{
    Abc_Obj_t * pTemp;
    int i;
    // mark the fanins of the cone
    Abc_NodesMark( vLeaves );
    // collect the nodes in the DFS order
    Vec_PtrClear( vVisited );
    // add the fanins
    if ( fIncludeFanins )
        Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pTemp, i )
            Vec_PtrPush( vVisited, pTemp );
    // add other nodes
    for ( i = 0; i < nRoots; i++ )
        Abc_NodeConeMarkCollect_rec( ppRoots[i], vVisited );
    // unmark both sets
    Abc_NodesUnmark( vLeaves );
    Abc_NodesUnmark( vVisited );
}